

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutosvg.c
# Opt level: O0

void transform_view_rect(view_position_t *position,plutovg_rect_t *dst_rect,plutovg_rect_t *src_rect
                        )

{
  float fVar1;
  float fVar2;
  float fVar3;
  view_align_t vVar4;
  float fVar5;
  float scale_1;
  float scale;
  float image_height;
  float image_width;
  float view_height;
  float view_width;
  plutovg_rect_t *src_rect_local;
  plutovg_rect_t *dst_rect_local;
  view_position_t *position_local;
  
  if (position->align == view_align_none) {
    return;
  }
  fVar1 = dst_rect->w;
  fVar2 = dst_rect->h;
  fVar3 = src_rect->w;
  fVar5 = src_rect->h;
  if (position->scale != view_scale_meet) {
    if (position->scale != view_scale_slice) {
      return;
    }
    if (fVar2 < fVar1 * (fVar5 / fVar3)) {
      src_rect->h = fVar2 * (fVar3 / fVar1);
      if (position->align - view_align_x_min_y_mid < 3) {
        src_rect->y = (fVar5 - src_rect->h) * 0.5 + src_rect->y;
      }
      else if (position->align - view_align_x_min_y_max < 3) {
        src_rect->y = (fVar5 - src_rect->h) + src_rect->y;
      }
    }
    if (fVar2 / (fVar5 / fVar3) <= fVar1) {
      return;
    }
    src_rect->w = fVar1 * (fVar5 / fVar2);
    vVar4 = position->align;
    if (vVar4 != view_align_x_mid_y_min) {
      if (vVar4 != view_align_x_max_y_min) {
        if (vVar4 == view_align_x_mid_y_mid) goto LAB_0010acd3;
        if (vVar4 != view_align_x_max_y_mid) {
          if (vVar4 == view_align_x_mid_y_max) goto LAB_0010acd3;
          if (vVar4 != view_align_x_max_y_max) {
            return;
          }
        }
      }
      src_rect->x = (fVar3 - src_rect->w) + src_rect->x;
      return;
    }
LAB_0010acd3:
    src_rect->x = (fVar3 - src_rect->w) * 0.5 + src_rect->x;
    return;
  }
  fVar5 = fVar5 / fVar3;
  if (fVar1 * fVar5 < fVar2) {
    dst_rect->h = fVar1 * fVar5;
    if (position->align - view_align_x_min_y_mid < 3) {
      dst_rect->y = (fVar2 - dst_rect->h) * 0.5 + dst_rect->y;
    }
    else if (position->align - view_align_x_min_y_max < 3) {
      dst_rect->y = (fVar2 - dst_rect->h) + dst_rect->y;
    }
  }
  if (fVar1 <= fVar2 / fVar5) {
    return;
  }
  dst_rect->w = fVar2 / fVar5;
  vVar4 = position->align;
  if (vVar4 == view_align_x_mid_y_min) {
LAB_0010ab43:
    dst_rect->x = (fVar1 - dst_rect->w) * 0.5 + dst_rect->x;
  }
  else {
    if (vVar4 != view_align_x_max_y_min) {
      if (vVar4 == view_align_x_mid_y_mid) goto LAB_0010ab43;
      if (vVar4 != view_align_x_max_y_mid) {
        if (vVar4 == view_align_x_mid_y_max) goto LAB_0010ab43;
        if (vVar4 != view_align_x_max_y_max) {
          return;
        }
      }
    }
    dst_rect->x = (fVar1 - dst_rect->w) + dst_rect->x;
  }
  return;
}

Assistant:

static void transform_view_rect(const view_position_t* position, plutovg_rect_t* dst_rect, plutovg_rect_t* src_rect)
{
    if(position->align == view_align_none)
        return;
    float view_width = dst_rect->w;
    float view_height = dst_rect->h;
    float image_width = src_rect->w;
    float image_height = src_rect->h;
    if(position->scale == view_scale_meet) {
        float scale = image_height / image_width;
        if(view_height > view_width * scale) {
            dst_rect->h = view_width * scale;
            switch(position->align) {
            case view_align_x_min_y_mid:
            case view_align_x_mid_y_mid:
            case view_align_x_max_y_mid:
                dst_rect->y += (view_height - dst_rect->h) * 0.5f;
                break;
            case view_align_x_min_y_max:
            case view_align_x_mid_y_max:
            case view_align_x_max_y_max:
                dst_rect->y += view_height - dst_rect->h;
                break;
            default:
                break;
            }
        }

        if(view_width > view_height / scale) {
            dst_rect->w = view_height / scale;
            switch(position->align) {
            case view_align_x_mid_y_min:
            case view_align_x_mid_y_mid:
            case view_align_x_mid_y_max:
                dst_rect->x += (view_width - dst_rect->w) * 0.5f;
                break;
            case view_align_x_max_y_min:
            case view_align_x_max_y_mid:
            case view_align_x_max_y_max:
                dst_rect->x += view_width - dst_rect->w;
                break;
            default:
                break;
            }
        }
    } else if(position->scale == view_scale_slice) {
        float scale = image_height / image_width;
        if(view_height < view_width * scale) {
            src_rect->h = view_height * (image_width / view_width);
            switch(position->align) {
            case view_align_x_min_y_mid:
            case view_align_x_mid_y_mid:
            case view_align_x_max_y_mid:
                src_rect->y += (image_height - src_rect->h) * 0.5f;
                break;
            case view_align_x_min_y_max:
            case view_align_x_mid_y_max:
            case view_align_x_max_y_max:
                src_rect->y += image_height - src_rect->h;
                break;
            default:
                break;
            }
        }

        if(view_width < view_height / scale) {
            src_rect->w = view_width * (image_height / view_height);
            switch(position->align) {
            case view_align_x_mid_y_min:
            case view_align_x_mid_y_mid:
            case view_align_x_mid_y_max:
                src_rect->x += (image_width - src_rect->w) * 0.5f;
                break;
            case view_align_x_max_y_min:
            case view_align_x_max_y_mid:
            case view_align_x_max_y_max:
                src_rect->x += image_width - src_rect->w;
                break;
            default:
                break;
            }
        }
    }
}